

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  undefined8 uVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  istream *this;
  ostream *poVar5;
  int iVar6;
  int *piVar7;
  ulong uVar8;
  int *piVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  undefined8 uStack_b0;
  int aiStack_a8 [2];
  undefined1 local_a0 [8];
  list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> lake;
  string *local_80;
  string row;
  int local_58;
  int N;
  int X;
  int Y;
  uint local_48;
  uint local_44;
  int W;
  int H;
  value_type local_38;
  pos_t p;
  
  uStack_b0 = 0x102293;
  std::istream::operator>>((istream *)&std::cin,(int *)&local_48);
  uStack_b0 = 0x10229b;
  std::istream::ignore();
  uStack_b0 = 0x1022aa;
  std::istream::operator>>((istream *)&std::cin,(int *)&local_44);
  uStack_b0 = 0x1022b2;
  std::istream::ignore();
  uVar12 = (ulong)local_44;
  lVar2 = -(local_48 * uVar12 * 4 + 0xf & 0xfffffffffffffff0);
  piVar9 = (int *)((long)aiStack_a8 + lVar2);
  lVar10 = 0;
  lake.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl._M_node.
  _M_size = (size_t)aiStack_a8;
  _X = piVar9;
  while( true ) {
    if ((int)local_44 <= lVar10) {
      *(undefined8 *)((long)aiStack_a8 + lVar2 + -8) = 0x102372;
      std::istream::operator>>((istream *)&std::cin,(int *)(row.field_2._M_local_buf + 0xc));
      *(undefined8 *)((long)aiStack_a8 + lVar2 + -8) = 0x10237a;
      std::istream::ignore();
      iVar11 = 0;
      while (iVar11 < (int)row.field_2._12_4_) {
        _X = (int *)CONCAT44(Y,iVar11);
        *(undefined8 *)((long)aiStack_a8 + lVar2 + -8) = 0x1023a2;
        this = (istream *)std::istream::operator>>((istream *)&std::cin,&local_58);
        *(undefined8 *)((long)aiStack_a8 + lVar2 + -8) = 0x1023ae;
        std::istream::operator>>(this,&N);
        *(undefined8 *)((long)aiStack_a8 + lVar2 + -8) = 0x1023b6;
        std::istream::ignore();
        iVar11 = piVar9[(long)local_58 * uVar12 + (long)N];
        if (iVar11 == -1) {
          row._M_string_length = 0;
          lake.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          _M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
          local_38.second = N;
          local_38.first = local_58;
          local_a0 = (undefined1  [8])local_a0;
          lake.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          _M_node.super__List_node_base._M_next = (_List_node_base *)local_a0;
          local_80 = (string *)&local_80;
          row._M_dataplus._M_p = (pointer)&local_80;
          *(undefined8 *)((long)aiStack_a8 + lVar2 + -8) = 0x10240c;
          std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                    ((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&local_80,
                     &local_38);
          iVar11 = 0;
          while (local_80 != (string *)&local_80) {
            local_38 = *(value_type *)(local_80 + 0x10);
            *(undefined8 *)((long)aiStack_a8 + lVar2 + -8) = 0x10242c;
            std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
            pop_front((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&local_80)
            ;
            if (piVar9[(long)local_38.first * uVar12 + (long)local_38.second] == -1) {
              iVar11 = iVar11 + 1;
              piVar9[(long)local_38.first * uVar12 + (long)local_38.second] = iVar11;
              *(undefined8 *)((long)aiStack_a8 + lVar2 + -8) = 0x102455;
              std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
              push_back((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_a0
                        ,&local_38);
              if (0 < local_38.first) {
                W = local_38.first + -1;
                H = local_38.second;
                *(undefined8 *)((long)aiStack_a8 + lVar2 + -8) = 0x102473;
                std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                push_back((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                          &local_80,(value_type *)&W);
              }
              iVar6 = local_38.first;
              if (0 < local_38.second) {
                H = local_38.second + -1;
                W = local_38.first;
                *(undefined8 *)((long)aiStack_a8 + lVar2 + -8) = 0x102491;
                std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                push_back((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                          &local_80,(value_type *)&W);
                iVar6 = local_38.first;
              }
              iVar3 = local_38.second;
              if (iVar6 < (int)(local_48 - 1)) {
                W = iVar6 + 1;
                H = local_38.second;
                *(undefined8 *)((long)aiStack_a8 + lVar2 + -8) = 0x1024b4;
                std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                push_back((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                          &local_80,(value_type *)&W);
                iVar3 = local_38.second;
              }
              if (iVar3 < (int)(local_44 - 1)) {
                H = iVar3 + 1;
                W = local_38.first;
                *(undefined8 *)((long)aiStack_a8 + lVar2 + -8) = 0x1024db;
                std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                push_back((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                          &local_80,(value_type *)&W);
              }
            }
          }
          while (local_a0 != (undefined1  [8])local_a0) {
            piVar9[(long)*(int *)&((_List_node_base *)((long)local_a0 + 0x10))->_M_next * uVar12 +
                   (long)*(int *)((long)&((_List_node_base *)((long)local_a0 + 0x10))->_M_next + 4)]
                 = iVar11;
            *(undefined8 *)((long)aiStack_a8 + lVar2 + -8) = 0x1024fc;
            std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
            pop_front((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_a0);
          }
          *(undefined8 *)((long)aiStack_a8 + lVar2 + -8) = 0x102510;
          std::__cxx11::_List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
          _M_clear((_List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                   local_a0);
          *(undefined8 *)((long)aiStack_a8 + lVar2 + -8) = 0x102518;
          std::__cxx11::_List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
          _M_clear((_List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                   &local_80);
        }
        *(undefined8 *)((long)aiStack_a8 + lVar2 + -8) = 0x102527;
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar11);
        *(undefined8 *)((long)aiStack_a8 + lVar2 + -8) = 0x10252f;
        std::endl<char,std::char_traits<char>>(poVar5);
        iVar11 = X + 1;
      }
      return 0;
    }
    local_80 = (string *)&row._M_string_length;
    row._M_dataplus._M_p = (pointer)0x0;
    row._M_string_length = row._M_string_length & 0xffffffffffffff00;
    *(undefined8 *)((long)aiStack_a8 + lVar2 + -8) = 0x102310;
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&local_80);
    if (row._M_dataplus._M_p != (pointer)(long)(int)local_48) break;
    uVar4 = (ulong)local_48;
    if ((int)local_48 < 1) {
      uVar4 = 0;
    }
    piVar7 = _X;
    for (uVar8 = 0; uVar4 != uVar8; uVar8 = uVar8 + 1) {
      *piVar7 = -(uint)(local_80[uVar8] == (string)0x4f);
      piVar7 = piVar7 + uVar12;
    }
    *(undefined8 *)((long)aiStack_a8 + lVar2 + -8) = 0x102355;
    std::__cxx11::string::~string((string *)&local_80);
    lVar10 = lVar10 + 1;
    _X = _X + 1;
  }
  *(undefined8 *)((long)aiStack_a8 + lVar2 + -8) = 0x1b;
  uVar1 = *(undefined8 *)((long)aiStack_a8 + lVar2 + -8);
  *(undefined1 **)((long)aiStack_a8 + lVar2 + -8) = &LAB_0010256b;
  __assert_fail("static_cast<size_t>(W) == row.length()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kvirund[P]codingame/hard/surface/main.cpp"
                ,(uint)uVar1,"int main()");
}

Assistant:

int main()
{
	int W;
	int H;
	std::cin >> W;
	std::cin.ignore();
	std::cin >> H;
	std::cin.ignore();

typedef std::pair<int, int> pos_t;
    int surf[W][H];
	for (int i = 0; i < H; i++)
	{
	    std::string row;
	    std::getline(std::cin, row);
	    assert(static_cast<size_t>(W) == row.length());
	    int l = row.length();
	    for (int j = 0; j < l; j++)
	    {
	        if ('O' == row[j])
	        {
	            surf[j][i] = -1;
	        }
	        else
	        {
	            surf[j][i] = 0;
	        }
	    }
	}
	
    // Tests
    int N;
    std::cin >> N;
    std::cin.ignore();
	for (int i = 0; i < N; i++)
	{
	    int X;
	    int Y;
	    std::cin >> X >> Y;
	    std::cin.ignore();
	    
	    int result;
	    if (-1 == surf[X][Y])
	    {
	        // Fill
	        result = 0;
	        std::list<pos_t> to_process;
	        std::list<pos_t> lake;
	        
	        to_process.push_back(pos_t(X, Y));
	        while (!to_process.empty())
	        {
	            const pos_t p = to_process.front();
	            to_process.pop_front();
	            if (-1 == surf[p.first][p.second])
	            {
	                result++;
	                surf[p.first][p.second] = result;
	                lake.push_back(p);
	                
	                if (0 < p.first)
	                {
	                    to_process.push_back(pos_t(p.first - 1, p.second));
	                }
	                if (0 < p.second)
	                {
	                    to_process.push_back(pos_t(p.first, p.second - 1));
	                }
	                if (p.first < W - 1)
	                {
	                    to_process.push_back(pos_t(p.first + 1, p.second));
	                }
	                if (p.second < H - 1)
	                {
	                    to_process.push_back(pos_t(p.first, p.second + 1));
	                }
	            }
	        }
	        
	        while (!lake.empty())
	        {
	            const pos_t p = lake.front();
	            surf[p.first][p.second] = result;
	            lake.pop_front();
	        }
	    }
	    else
	    {
	        result = surf[X][Y];
	    }
	    std::cout << result << std::endl;
	}

	return 0;
}